

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

art_val_t * art_insert(art_t *art,art_key_chunk_t *key,art_val_t val)

{
  art_ref_t aVar1;
  art_node_t *paVar2;
  art_val_t in_RDX;
  art_key_chunk_t *in_RSI;
  art_t *in_RDI;
  art_ref_t leaf;
  art_ref_t in_stack_00000048;
  uint8_t in_stack_00000057;
  art_key_chunk_t *in_stack_00000058;
  art_ref_t in_stack_00000060;
  art_t *in_stack_00000068;
  art_val_t *local_8;
  
  aVar1 = art_leaf_create(in_RDI,in_RSI,in_RDX);
  if (in_RDI->root == 0) {
    in_RDI->root = aVar1;
    paVar2 = art_deref(in_RDI,(art_ref_t)in_RSI);
  }
  else {
    aVar1 = art_insert_at(in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000057,
                          in_stack_00000048);
    in_RDI->root = aVar1;
    paVar2 = art_deref(in_RDI,(art_ref_t)in_RSI);
  }
  local_8 = (art_val_t *)((long)paVar2 + 8);
  return local_8;
}

Assistant:

art_val_t *art_insert(art_t *art, const art_key_chunk_t *key, art_val_t val) {
    art_ref_t leaf = art_leaf_create(art, key, val);
    if (art->root == CROARING_ART_NULL_REF) {
        art->root = leaf;
        return &((art_leaf_t *)art_deref(art, leaf))->val;
    }
    art->root = art_insert_at(art, art->root, key, 0, leaf);
    return &((art_leaf_t *)art_deref(art, leaf))->val;
}